

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_trace.c
# Opt level: O3

void trace_genrec_(Integer *ga,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Integer *op)

{
  int iVar1;
  bool bVar2;
  Integer *pIVar3;
  long *plVar4;
  FILE *__stream;
  int iVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  int ndim;
  int block [2];
  int dims [2];
  int type;
  int hi [2];
  int lo [2];
  char fname [15];
  int local_b8;
  uint local_b4;
  long *local_b0;
  FILE *local_a8;
  uint auStack_a0 [4];
  int *local_90;
  int *local_88;
  Integer *local_80;
  Integer *local_78;
  Integer *local_70;
  Integer *local_68;
  Integer *local_60;
  int local_54;
  int local_50 [4];
  char local_3f [15];
  
  local_b0 = ga;
  iVar5 = GA_Nodeid();
  local_b4 = GA_Nnodes();
  plVar4 = local_b0;
  if (MAX_EVENTS <= current) {
    return;
  }
  if (iVar5 == 0) {
    lVar7 = (long)ganum;
    if (0 < lVar7) {
      lVar10 = 0;
      bVar2 = false;
      do {
        if (*local_b0 == (long)galog[lVar10]) {
          bVar2 = true;
        }
        lVar10 = lVar10 + 1;
      } while (lVar7 != lVar10);
      if (bVar2) goto LAB_00110541;
    }
    ganum = ganum + 1;
    galog[lVar7] = (int)*local_b0;
    local_68 = jhi;
    sprintf(local_3f,"distrib.%d");
    local_a8 = fopen(local_3f,"w");
    NGA_Inquire((int)*plVar4,&local_54,&local_b8,(int *)(auStack_a0 + 2));
    lVar7 = (long)(int)local_b4;
    local_88 = (int *)malloc(lVar7 * 4);
    if (local_88 == (int *)0x0) {
      GA_Error("malloc failed for proclist",0);
    }
    local_60 = op;
    piVar6 = (int *)malloc(lVar7 << 4);
    if (piVar6 == (int *)0x0) {
      GA_Error("malloc failed for regions",0);
    }
    lVar7 = (long)local_b8;
    if (0 < lVar7) {
      lVar10 = 0;
      memset(local_50 + 2,0,lVar7 * 4);
      do {
        local_50[lVar10] = auStack_a0[lVar10 + 2] - 1;
        lVar10 = lVar10 + 1;
      } while (lVar7 != lVar10);
    }
    local_70 = jlo;
    iVar5 = NGA_Locate_region((int)*local_b0,local_50 + 2,local_50,piVar6,local_88);
    if (iVar5 < 1) {
      GA_Error("error in NGA_Locate_region",iVar5);
    }
    __stream = local_a8;
    uVar9 = (ulong)local_b4;
    if (0 < (long)local_b8) {
      piVar8 = piVar6 + 2;
      lVar7 = 0;
      do {
        auStack_a0[lVar7] = 0;
        if (0 < (int)local_b4) {
          lVar10 = 0;
          uVar11 = 0;
          iVar5 = 0;
          do {
            iVar1 = *(int *)((long)piVar8 + lVar10);
            if (iVar5 < iVar1) {
              uVar11 = uVar11 + 1;
              auStack_a0[lVar7] = uVar11;
              iVar5 = iVar1;
            }
            lVar10 = lVar10 + 0x10;
          } while (uVar9 << 4 != lVar10);
        }
        lVar7 = lVar7 + 1;
        piVar8 = piVar8 + 1;
      } while (lVar7 != local_b8);
    }
    local_90 = piVar6;
    local_80 = ilo;
    local_78 = ihi;
    fprintf(local_a8,"%d\n");
    if (0 < local_b8) {
      lVar7 = 0;
      do {
        fprintf(__stream,"%d ",(ulong)auStack_a0[lVar7 + 2]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_b8);
    }
    fputc(10,__stream);
    if (0 < local_b8) {
      lVar7 = 0;
      do {
        uVar11 = auStack_a0[lVar7] - 1;
        if (auStack_a0[lVar7] == 1) {
          uVar11 = 1;
        }
        fprintf(__stream,"%d ",(ulong)uVar11);
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_b8);
    }
    fputc(10,__stream);
    if (0 < local_b8) {
      piVar6 = local_90 + 2;
      lVar7 = 0;
      do {
        uVar11 = auStack_a0[lVar7];
        if (uVar11 == 1) {
          fprintf(local_a8,"%d\n",(ulong)auStack_a0[lVar7 + 2]);
        }
        else if (0 < (int)local_b4) {
          lVar10 = 0;
          iVar5 = 0;
          uVar12 = 0;
          do {
            if (iVar5 < *(int *)((long)piVar6 + lVar10)) {
              uVar12 = uVar12 + 1;
              if (uVar12 == uVar11) break;
              fprintf(local_a8,"%d\n",(ulong)(*(int *)((long)piVar6 + lVar10) + 1));
              iVar5 = *(int *)((long)piVar6 + lVar10);
            }
            lVar10 = lVar10 + 0x10;
          } while (uVar9 << 4 != lVar10);
        }
        lVar7 = lVar7 + 1;
        piVar6 = piVar6 + 1;
      } while (lVar7 < local_b8);
    }
    fclose(local_a8);
    free(local_90);
    free(local_88);
    op = local_60;
    ilo = local_80;
    jlo = local_70;
    ihi = local_78;
    jhi = local_68;
  }
LAB_00110541:
  pIVar3 = tlog;
  uVar9 = (ulong)(tt0 * 1000000.0);
  tlog[current * 2] = (long)uVar9 >> 0x3f & (long)(tt0 * 1000000.0 - 9.223372036854776e+18) | uVar9;
  uVar9 = (ulong)(tt1 * 1000000.0);
  pIVar3[current * 2 + 1] =
       (long)uVar9 >> 0x3f & (long)(tt1 * 1000000.0 - 9.223372036854776e+18) | uVar9;
  pIVar3 = indlog;
  indlog[current * 6] = *local_b0;
  pIVar3[current * 6 + 1] = *ilo;
  pIVar3[current * 6 + 2] = *ihi;
  pIVar3[current * 6 + 3] = *jlo;
  pIVar3[current * 6 + 4] = *jhi;
  pIVar3[current * 6 + 5] = *op;
  current = current + 1;
  return;
}

Assistant:

void trace_genrec_(Integer *ga, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi,
                   Integer *op)
{
    int i, d, has_record, counter;
    FILE *fout;
    char fname[15];
    typedef struct {
       int lo[2];
       int hi[2];
    } patch_t;
    patch_t *regions;
    int *proclist;
    int ndim, dims[2], tmp_dims[2], lo[2], hi[2], type, block[2];
    int me=GA_Nodeid(), nproc=GA_Nnodes(), proc;
    
    if(current >=  MAX_EVENTS) return;

    /* only node 0 does the bookkeeping */
    if(me == 0) {
        /* test if this ga has been recorded */
        has_record = 0;
        for(i=0; i<ganum; i++)
            if(*ga == (long) galog[i]) has_record = 1;

        if(!has_record) {
            galog[ganum++] = (int)*ga;
            
            sprintf(fname, "distrib.%d",(int) *ga);
            fout = fopen(fname,"w");
            
            NGA_Inquire((int)*ga, &type, &ndim, dims);
            
            /* get memory for arrays describing distribution */
            proclist = (int*)malloc(nproc*sizeof(int));
            if(!proclist)GA_Error("malloc failed for proclist",0);
            regions = (patch_t*)malloc(nproc*sizeof(patch_t));
            if(!regions)GA_Error("malloc failed for regions",0);

            for(d=0; d<ndim; d++) { lo[d] = 0; hi[d] = dims[d] -1;}

            proc = NGA_Locate_region((int)*ga, lo, hi, (int*)regions, proclist);
            if(proc<1) GA_Error("error in NGA_Locate_region",proc);
            
            for(d=0; d<ndim; d++) {
                tmp_dims[d] = 0; block[d] = 0;
                for(i=0; i<nproc; i++)
                    if(regions[i].hi[d] > tmp_dims[d]) {
                        block[d]++;
                        tmp_dims[d] = regions[i].hi[d];
                    }
            }

            /* print the number of processed */
            fprintf(fout, "%d\n", nproc);
            /* print dimensions */
            for(d=0; d<ndim; d++) fprintf(fout, "%d ", dims[d]);
            fprintf(fout, "\n");

            /* print number of lines to draw for each dimension */
            for(d=0; d<ndim; d++) 
                if(block[d] == 1) fprintf(fout, "%d ", block[d]);
                else fprintf(fout, "%d ", block[d]-1);
            fprintf(fout, "\n");

            /* print the offset for each line */
            for(d=0; d<ndim; d++) {
                if(block[d] == 1) fprintf(fout, "%d\n", dims[d]);
                else {
                    tmp_dims[d] = 0;
                    counter = 0;
                    for(i=0; i<nproc; i++)
                        if(regions[i].hi[d] > tmp_dims[d]) {
                            counter++;
                            if(counter == block[d]) break;
                            fprintf(fout, "%d\n",
                                    regions[i].hi[d]+1);
                            tmp_dims[d] = regions[i].hi[d];
                        }
                }
            }
            fclose(fout);
            free(regions); free(proclist);
        }
    }

    tlog[current*2]     = (unsigned long)(tt0 * 1000000);
    tlog[current*2+1]   = (unsigned long)(tt1 * 1000000);
    indlog[current*6]   = *ga;
    indlog[current*6+1] = *ilo;
    indlog[current*6+2] = *ihi;
    indlog[current*6+3] = *jlo;
    indlog[current*6+4] = *jhi;
    indlog[current*6+5] = *op;
    current++;
}